

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

optional<LockPoints> *
CalculateLockPointsAtTip(CBlockIndex *tip,CCoinsView *coins_view,CTransaction *tx)

{
  bool bVar1;
  CBlockIndex *pCVar2;
  vector<int,_std::allocator<int>_> *file;
  reference piVar3;
  optional<LockPoints> *this;
  CBlockIndex **val;
  long in_RSI;
  optional<LockPoints> *in_RDI;
  long in_FS_OFFSET;
  pair<int,_long> pVar4;
  vector<int,_std::allocator<int>_> *__range1;
  type *min_time;
  type *min_height;
  int height;
  iterator __end1;
  iterator __begin1;
  int max_input_height;
  optional<std::vector<int,_std::allocator<int>_>_> prev_heights;
  CBlockIndex next_tip;
  pair<int,_long> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  CBlockIndex *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe60;
  int *piVar5;
  int line;
  optional<LockPoints> *poVar6;
  CTransaction *in_stack_fffffffffffffea8;
  CTransaction *in_stack_fffffffffffffec0;
  CCoinsView *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_d0 [2];
  CBlockIndex **local_c8;
  int local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    __assert_fail("tip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc9,
                  "std::optional<LockPoints> CalculateLockPointsAtTip(CBlockIndex *, const CCoinsView &, const CTransaction &)"
                 );
  }
  poVar6 = in_RDI;
  anon_unknown.dwarf_2401980::CalculatePrevHeights
            ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bVar1 = std::optional<std::vector<int,_std::allocator<int>_>_>::has_value
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffe38)
  ;
  if (bVar1) {
    CBlockIndex::CBlockIndex(in_stack_fffffffffffffe48);
    local_88 = *(int *)(in_RSI + 0x18) + 1;
    pCVar2 = (CBlockIndex *)
             std::optional<std::vector<int,_std::allocator<int>_>_>::value
                       ((optional<std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffe48);
    pVar4 = CalculateSequenceLocks
                      (in_stack_fffffffffffffea8,(int)((ulong)poVar6 >> 0x20),
                       (vector<int,_std::allocator<int>_> *)in_RDI,pCVar2);
    val = (CBlockIndex **)pVar4.second;
    local_d0[0] = pVar4.first;
    piVar5 = local_d0;
    local_c8 = val;
    std::get<0ul,int,long>(in_stack_fffffffffffffe38);
    std::get<1ul,int,long>(in_stack_fffffffffffffe38);
    file = std::optional<std::vector<int,_std::allocator<int>_>_>::value
                     ((optional<std::vector<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffe48
                     );
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    while( true ) {
      bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe48,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      line = (int)((ulong)piVar5 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe38);
      if (*piVar3 != local_88) {
        in_stack_fffffffffffffe60 =
             std::max<int>((int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           &in_stack_fffffffffffffe38->first);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffe38);
    }
    pCVar2 = CBlockIndex::GetAncestor(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    this = (optional<LockPoints> *)
           inline_assertion_check<true,CBlockIndex*>
                     (val,(char *)file,line,(char *)in_stack_fffffffffffffe60,(char *)pCVar2);
    std::optional<LockPoints>::optional<LockPoints,_true>
              (this,(LockPoints *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  else {
    std::optional<LockPoints>::optional(in_RDI);
  }
  std::optional<std::vector<int,_std::allocator<int>_>_>::~optional
            ((optional<std::vector<int,_std::allocator<int>_>_> *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return poVar6;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<LockPoints> CalculateLockPointsAtTip(
    CBlockIndex* tip,
    const CCoinsView& coins_view,
    const CTransaction& tx)
{
    assert(tip);

    auto prev_heights{CalculatePrevHeights(*tip, coins_view, tx)};
    if (!prev_heights.has_value()) return std::nullopt;

    CBlockIndex next_tip;
    next_tip.pprev = tip;
    // When SequenceLocks() is called within ConnectBlock(), the height
    // of the block *being* evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    next_tip.nHeight = tip->nHeight + 1;
    const auto [min_height, min_time] = CalculateSequenceLocks(tx, STANDARD_LOCKTIME_VERIFY_FLAGS, prev_heights.value(), next_tip);

    // Also store the hash of the block with the highest height of
    // all the blocks which have sequence locked prevouts.
    // This hash needs to still be on the chain
    // for these LockPoint calculations to be valid
    // Note: It is impossible to correctly calculate a maxInputBlock
    // if any of the sequence locked inputs depend on unconfirmed txs,
    // except in the special case where the relative lock time/height
    // is 0, which is equivalent to no sequence lock. Since we assume
    // input height of tip+1 for mempool txs and test the resulting
    // min_height and min_time from CalculateSequenceLocks against tip+1.
    int max_input_height{0};
    for (const int height : prev_heights.value()) {
        // Can ignore mempool inputs since we'll fail if they had non-zero locks
        if (height != next_tip.nHeight) {
            max_input_height = std::max(max_input_height, height);
        }
    }

    // tip->GetAncestor(max_input_height) should never return a nullptr
    // because max_input_height is always less than the tip height.
    // It would, however, be a bad bug to continue execution, since a
    // LockPoints object with the maxInputBlock member set to nullptr
    // signifies no relative lock time.
    return LockPoints{min_height, min_time, Assert(tip->GetAncestor(max_input_height))};
}